

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

QPoint __thiscall QPushButtonPrivate::adjustedMenuPosition(QPushButtonPrivate *this)

{
  long lVar1;
  bool bVar2;
  Orientation OVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LayoutDirection LVar7;
  QToolBar *pQVar8;
  QMenu *pQVar9;
  QPushButtonPrivate *in_RDI;
  long in_FS_OFFSET;
  int y;
  int x;
  QToolBar *tb;
  bool horizontal;
  QPushButton *q;
  QRect availableGeometry;
  QPoint globalPos;
  QSize menuSize;
  QRect rect;
  QWidgetItem item;
  QWidget *in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QPoint local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar2 = true;
  pQVar8 = qobject_cast<QToolBar*>((QObject *)0x6665a4);
  if ((pQVar8 != (QToolBar *)0x0) &&
     (OVar3 = QToolBar::orientation
                        ((QToolBar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)),
     OVar3 == Vertical)) {
    bVar2 = false;
  }
  QWidgetItem::QWidgetItem
            ((QWidgetItem *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  QWidgetItem::geometry
            ((QWidgetItem *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QRect::x((QRect *)0x66664f);
  QWidget::x((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  QRect::y((QRect *)0x666679);
  QWidget::y((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  QRect::width((QRect *)in_stack_fffffffffffffef8);
  QRect::height((QRect *)in_stack_fffffffffffffef8);
  QRect::setRect((QRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 in_stack_ffffffffffffff08);
  pQVar9 = QPointer<QMenu>::operator->((QPointer<QMenu> *)0x6666f0);
  (**(code **)(*(long *)&pQVar9->super_QWidget + 0x70))();
  QRect::topLeft((QRect *)in_stack_fffffffffffffef8);
  QWidget::mapToGlobal
            ((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (QPoint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QPoint::x((QPoint *)0x666759);
  QPoint::y((QPoint *)0x66676a);
  QRect::center((QRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  QWidget::mapToGlobal
            ((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             (QPoint *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QWidgetPrivate::availableScreenGeometry
            ((QWidget *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (QPoint *)in_stack_fffffffffffffef8,false);
  if (bVar2) {
    iVar4 = QPoint::y((QPoint *)0x666814);
    iVar5 = QRect::height((QRect *)in_stack_fffffffffffffef8);
    iVar4 = iVar4 + iVar5;
    iVar5 = QSize::height((QSize *)0x66683e);
    iVar6 = QRect::bottom((QRect *)0x666857);
    if (iVar6 < iVar4 + iVar5) {
      iVar4 = QPoint::y((QPoint *)0x666885);
      iVar5 = QSize::height((QSize *)0x666896);
      iVar4 = iVar4 - iVar5;
      iVar5 = QRect::y((QRect *)0x6668af);
      if (iVar5 <= iVar4) {
        QSize::height((QSize *)0x6668c6);
      }
    }
    else {
      QRect::height((QRect *)in_stack_fffffffffffffef8);
    }
    LVar7 = QWidget::layoutDirection((QWidget *)0x6668e1);
    if (LVar7 == RightToLeft) {
      QRect::width((QRect *)in_stack_fffffffffffffef8);
      QSize::width((QSize *)0x666904);
    }
  }
  else {
    iVar4 = QPoint::x((QPoint *)0x666926);
    iVar5 = QRect::width((QRect *)in_stack_fffffffffffffef8);
    iVar4 = iVar4 + iVar5;
    pQVar9 = QPointer<QMenu>::operator->((QPointer<QMenu> *)0x666954);
    (**(code **)(*(long *)&pQVar9->super_QWidget + 0x70))();
    iVar5 = QSize::width((QSize *)0x666972);
    iVar4 = iVar4 + iVar5;
    iVar5 = QRect::right((QRect *)0x66698b);
    if (iVar5 < iVar4) {
      in_stack_ffffffffffffff00 = QPoint::x((QPoint *)0x6669b9);
      in_stack_ffffffffffffff04 = QSize::width((QSize *)0x6669ca);
      in_stack_ffffffffffffff04 = in_stack_ffffffffffffff00 - in_stack_ffffffffffffff04;
      iVar5 = QRect::x((QRect *)0x6669e3);
      if (iVar5 <= in_stack_ffffffffffffff04) {
        QSize::width((QSize *)0x6669fa);
      }
    }
    else {
      QRect::width((QRect *)in_stack_fffffffffffffef8);
    }
  }
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),(int)in_stack_fffffffffffffef8);
  QWidgetItem::~QWidgetItem((QWidgetItem *)0x666a2c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QPoint QPushButtonPrivate::adjustedMenuPosition()
{
    Q_Q(QPushButton);

    bool horizontal = true;
#if QT_CONFIG(toolbar)
    QToolBar *tb = qobject_cast<QToolBar*>(parent);
    if (tb && tb->orientation() == Qt::Vertical)
        horizontal = false;
#endif

    QWidgetItem item(q);
    QRect rect = item.geometry();
    rect.setRect(rect.x() - q->x(), rect.y() - q->y(), rect.width(), rect.height());

    QSize menuSize = menu->sizeHint();
    QPoint globalPos = q->mapToGlobal(rect.topLeft());
    int x = globalPos.x();
    int y = globalPos.y();
    const QRect availableGeometry = QWidgetPrivate::availableScreenGeometry(q, q->mapToGlobal(rect.center()));
    if (horizontal) {
        if (globalPos.y() + rect.height() + menuSize.height() <= availableGeometry.bottom()) {
            y += rect.height();
        } else if (globalPos.y() - menuSize.height() >= availableGeometry.y()) {
            y -= menuSize.height();
        }
        if (q->layoutDirection() == Qt::RightToLeft)
            x += rect.width() - menuSize.width();
    } else {
        if (globalPos.x() + rect.width() + menu->sizeHint().width() <= availableGeometry.right()) {
            x += rect.width();
        } else if (globalPos.x() - menuSize.width() >= availableGeometry.x()) {
            x -= menuSize.width();
        }
    }

    return QPoint(x,y);
}